

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

Vec_Int_t * Cba_NtkCollectDfs(Cba_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *vObjs;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  
  vObjs = Vec_IntAlloc((p->vObjType).nSize + -1);
  for (iVar6 = 0; iVar6 < (p->vInputs).nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(&p->vInputs,iVar6);
    Vec_IntPush(vObjs,iVar2);
  }
  for (iVar6 = 0; iVar6 < (p->vSeq).nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(&p->vSeq,iVar6);
    Vec_IntPush(vObjs,iVar2);
  }
  Cba_NtkCleanObjCopies(p);
  iVar6 = vObjs->nSize;
  for (iVar2 = 0; iVar2 < iVar6; iVar2 = iVar2 + 1) {
    iVar3 = Vec_IntEntry(vObjs,iVar2);
    Cba_ObjSetCopy(p,iVar3,0);
  }
  for (iVar6 = 0; iVar6 < (p->vOutputs).nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(&p->vOutputs,iVar6);
    iVar3 = Cba_ObjFin0(p,iVar2);
    while( true ) {
      iVar4 = Cba_ObjFin0(p,iVar2 + 1);
      if (iVar4 <= iVar3) break;
      iVar4 = Cba_FinFon(p,iVar3);
      iVar4 = Cba_FonObj(p,iVar4);
      if (iVar4 != 0) {
        Cba_NtkCollectDfs_rec(p,iVar4,vObjs);
      }
      iVar3 = iVar3 + 1;
    }
  }
  for (iVar6 = 0; iVar6 < (p->vSeq).nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(&p->vSeq,iVar6);
    iVar3 = Cba_ObjFin0(p,iVar2);
    while( true ) {
      iVar4 = Cba_ObjFin0(p,iVar2 + 1);
      if (iVar4 <= iVar3) break;
      iVar4 = Cba_FinFon(p,iVar3);
      iVar4 = Cba_FonObj(p,iVar4);
      if (iVar4 != 0) {
        Cba_NtkCollectDfs_rec(p,iVar4,vObjs);
      }
      iVar3 = iVar3 + 1;
    }
  }
  for (iVar6 = 0; iVar6 < (p->vOutputs).nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(&p->vOutputs,iVar6);
    Vec_IntPush(vObjs,iVar2);
  }
  uVar1 = vObjs->nSize;
  iVar6 = (p->vObjType).nSize;
  if ((int)uVar1 < iVar6) {
    uVar7 = iVar6 - 1;
    if (uVar1 != uVar7) {
      uVar7 = Cba_NtkFindMissing(vObjs,uVar7);
      pcVar5 = Cba_NtkName(p);
      printf("Warning: DSF ordering for module \"%s\" collected %d out of %d objects.\n",pcVar5,
             (ulong)uVar1,(ulong)((p->vObjType).nSize - 1));
      if ((int)uVar7 < 1) {
        pcVar5 = "<unknown>";
      }
      else {
        iVar6 = Cba_ObjFon0(p,uVar7);
        pcVar5 = Cba_FonNameStr(p,iVar6);
      }
      printf("         For example, object %d with name \"%s\" is not reachable from outputs.\n",
             (ulong)uVar7,pcVar5);
    }
    return vObjs;
  }
  __assert_fail("Vec_IntSize(vObjs) <= Cba_NtkObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                ,0x296,"Vec_Int_t *Cba_NtkCollectDfs(Cba_Ntk_t *)");
}

Assistant:

Vec_Int_t * Cba_NtkCollectDfs( Cba_Ntk_t * p )
{
    int i, k, iObj, iFin, iFanin;
    Vec_Int_t * vObjs = Vec_IntAlloc( Cba_NtkObjNum(p) );
    // collect PIs and seq boxes
    Cba_NtkForEachPi( p, iObj, i )
        Vec_IntPush( vObjs, iObj );
    Cba_NtkForEachBoxSeq( p, iObj, i )
        Vec_IntPush( vObjs, iObj );
    // prepare leaves
    Cba_NtkCleanObjCopies( p );
    Vec_IntForEachEntry( vObjs, iObj, i )
        Cba_ObjSetCopy( p, iObj, 0 );
    // collect internal
    Cba_NtkForEachPo( p, iObj, i )
        Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
            Cba_NtkCollectDfs_rec( p, iFanin, vObjs );
    Cba_NtkForEachBoxSeq( p, iObj, i )
        Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
            Cba_NtkCollectDfs_rec( p, iFanin, vObjs );
    // collect POs
    Cba_NtkForEachPo( p, iObj, i )
        Vec_IntPush( vObjs, iObj );
    assert( Vec_IntSize(vObjs) <= Cba_NtkObjNum(p) );
    if ( Vec_IntSize(vObjs) != Cba_NtkObjNum(p) )
    {
        int iObj = Cba_NtkFindMissing( vObjs, Cba_NtkObjNum(p) );
        printf( "Warning: DSF ordering for module \"%s\" collected %d out of %d objects.\n", Cba_NtkName(p), Vec_IntSize(vObjs), Cba_NtkObjNum(p) );
        printf( "         For example, object %d with name \"%s\" is not reachable from outputs.\n", 
            iObj, iObj > 0 ? Cba_FonNameStr( p, Cba_ObjFon0(p, iObj) ) : "<unknown>" );
    }
    return vObjs;
}